

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerResults.cpp
# Opt level: O1

void __thiscall
I2sAnalyzerResults::GenerateFrameTabularText
          (I2sAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  Frame frame;
  char number_str [128];
  stringstream ss;
  Frame local_270 [16];
  ulonglong local_260;
  undefined1 local_250;
  char *local_248;
  char local_238 [16];
  char local_228 [128];
  stringstream local_1a8 [16];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_270);
  switch(local_250) {
  case 0:
    if ((display_base == Decimal) && (this->mSettings->mSigned == SignedInteger)) {
      AnalyzerHelpers::ConvertToSignedNumber(local_260,this->mSettings->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::ostream::_M_insert<long_long>((longlong)local_198);
      std::__cxx11::stringbuf::str();
      strcpy(local_228,local_248);
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_260,display_base,this->mSettings->mBitsPerWord,local_228,0x80);
    }
    AnalyzerResults::AddTabularText
              ((char *)this,"Ch 1: ",local_228,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 1:
    if ((display_base == Decimal) && (this->mSettings->mSigned == SignedInteger)) {
      AnalyzerHelpers::ConvertToSignedNumber(local_260,this->mSettings->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::ostream::_M_insert<long_long>((longlong)local_198);
      std::__cxx11::stringbuf::str();
      strcpy(local_228,local_248);
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_260,display_base,this->mSettings->mBitsPerWord,local_228,0x80);
    }
    AnalyzerResults::AddTabularText
              ((char *)this,"Ch 2: ",local_228,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    sprintf((char *)local_1a8,"%d",(ulong)this->mSettings->mBitsPerWord);
    AnalyzerResults::AddTabularText
              ((char *)this,"Error: too few bits, expecting ",(char *)local_1a8,(char *)0x0,
               (char *)0x0,(char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddTabularText
              ((char *)this,"Error: bits don\'t divide evenly between subframes",(char *)0x0,
               (char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_270);
  return;
}

Assistant:

void I2sAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    switch( I2sResultType( frame.mType ) )
    {
    case Channel1:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }

        AddTabularText( "Ch 1: ", number_str );
    }
    break;
    case Channel2:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }

        AddTabularText( "Ch 2: ", number_str );
    }
    break;
    case ErrorTooFewBits:
    {
        char bits_per_word[ 32 ];
        sprintf( bits_per_word, "%d", mSettings->mBitsPerWord );

        AddTabularText( "Error: too few bits, expecting ", bits_per_word );
    }
    break;
    case ErrorDoesntDivideEvenly:
    {
        AddTabularText( "Error: bits don't divide evenly between subframes" );
    }
    break;
    }
}